

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<bool> *target,string_view name,
          string_view value)

{
  int iVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ushort uVar2;
  size_type __rlen;
  ushort uVar3;
  format_args args;
  string_view fmt;
  char *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 0x100;
  uVar3 = 1;
  if (value._M_len != 0) {
    if (value._M_len == 5) {
      iVar1 = bcmp(value._M_str,"False",5);
      if ((iVar1 == 0) || (iVar1 = bcmp(value._M_str,"false",5), iVar1 == 0)) {
        uVar3 = 0;
        goto LAB_0073d55e;
      }
    }
    else if ((value._M_len == 4) &&
            ((iVar1 = bcmp(value._M_str,"True",4), iVar1 == 0 ||
             (iVar1 = bcmp(value._M_str,"true",4), iVar1 == 0)))) goto LAB_0073d55e;
    local_78 = value._M_str;
    local_70 = value._M_len;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x2c;
    local_68 = name._M_str;
    local_60 = name._M_len;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_50,(v11 *)"invalid value \'{}\' for boolean argument \'{}\'",fmt,args);
    set_abi_cxx11_();
    uVar3 = 0;
    uVar2 = 0;
  }
LAB_0073d55e:
  (target->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload_base<bool>)(uVar2 | uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}